

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O3

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type,TX_SIZE tx_size,TXFM_2D_FLIP_CFG *cfg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int8_t *piVar4;
  int8_t *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  
  cfg->tx_size = tx_size;
  iVar9 = 0;
  iVar6 = 0;
  if ((byte)(tx_type - 4) < 0xc) {
    lVar7 = (ulong)(byte)(tx_type - 4) * 4;
    iVar9 = *(int *)(&DAT_0056ddb4 + lVar7);
    iVar6 = *(int *)(&DAT_0056dde4 + lVar7);
  }
  cfg->ud_flip = iVar9;
  cfg->lr_flip = iVar6;
  bVar1 = ""[tx_type];
  bVar2 = ""[tx_type];
  lVar11 = (long)*(int *)((long)tx_size_wide_log2 + (ulong)((uint)tx_size * 4));
  lVar8 = (long)*(int *)((long)tx_size_high_log2 + (ulong)((uint)tx_size * 4));
  cfg->shift = av1_fwd_txfm_shift_ls[tx_size];
  lVar7 = lVar11 * 5;
  cfg->cos_bit_col = ""[lVar8 + lVar7 + 1];
  cfg->cos_bit_row = *(int8_t *)(lVar8 + lVar7 + 0x56dc04);
  bVar1 = *(byte *)((ulong)bVar1 + lVar8 * 4 + 0x521258);
  cfg->txfm_type_col = bVar1;
  bVar2 = *(byte *)((ulong)bVar2 + lVar11 * 4 + 0x521258);
  uVar12 = (ulong)bVar2;
  cfg->txfm_type_row = bVar2;
  cVar3 = "\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[bVar1];
  iVar6 = (int)cVar3;
  cfg->stage_num_col = iVar6;
  iVar9 = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[uVar12];
  cfg->stage_num_row = iVar9;
  cfg->stage_range_col[0] = '\0';
  cfg->stage_range_col[1] = '\0';
  cfg->stage_range_col[2] = '\0';
  cfg->stage_range_col[3] = '\0';
  cfg->stage_range_col[4] = '\0';
  cfg->stage_range_col[5] = '\0';
  cfg->stage_range_col[6] = '\0';
  cfg->stage_range_col[7] = '\0';
  *(undefined8 *)(cfg->stage_range_col + 8) = 0;
  cfg->stage_range_row[4] = '\0';
  cfg->stage_range_row[5] = '\0';
  cfg->stage_range_row[6] = '\0';
  cfg->stage_range_row[7] = '\0';
  cfg->stage_range_row[8] = '\0';
  cfg->stage_range_row[9] = '\0';
  cfg->stage_range_row[10] = '\0';
  cfg->stage_range_row[0xb] = '\0';
  piVar4 = fwd_txfm_range_mult2_list[bVar1];
  if ('\0' < cVar3) {
    uVar10 = 0xb;
    if (iVar6 - 1U < 0xb) {
      uVar10 = iVar6 - 1U;
    }
    uVar12 = 0;
    do {
      cfg->stage_range_col[uVar12] = (int8_t)((int)piVar4[uVar12] + 1U >> 1);
      uVar12 = uVar12 + 1;
    } while (uVar10 + 1 != uVar12);
    uVar12 = (ulong)cfg->txfm_type_row;
    iVar9 = cfg->stage_num_row;
  }
  if (0 < iVar9) {
    piVar5 = fwd_txfm_range_mult2_list[uVar12];
    uVar10 = 0xb;
    if (iVar9 - 1U < 0xb) {
      uVar10 = iVar9 - 1U;
    }
    uVar12 = 0;
    do {
      cfg->stage_range_row[uVar12] =
           (int8_t)((int)piVar4[(long)iVar6 + -1] + (int)piVar5[uVar12] + 1U >> 1);
      uVar12 = uVar12 + 1;
    } while (uVar10 + 1 != uVar12);
  }
  return;
}

Assistant:

void av1_get_fwd_txfm_cfg(TX_TYPE tx_type, TX_SIZE tx_size,
                          TXFM_2D_FLIP_CFG *cfg) {
  assert(cfg != NULL);
  cfg->tx_size = tx_size;
  set_flip_cfg(tx_type, cfg);
  const TX_TYPE_1D tx_type_1d_col = vtx_tab[tx_type];
  const TX_TYPE_1D tx_type_1d_row = htx_tab[tx_type];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  cfg->shift = av1_fwd_txfm_shift_ls[tx_size];
  cfg->cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  cfg->cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  cfg->txfm_type_col = av1_txfm_type_ls[txh_idx][tx_type_1d_col];
  assert(cfg->txfm_type_col != TXFM_TYPE_INVALID);
  cfg->txfm_type_row = av1_txfm_type_ls[txw_idx][tx_type_1d_row];
  assert(cfg->txfm_type_row != TXFM_TYPE_INVALID);
  cfg->stage_num_col = av1_txfm_stage_num_list[cfg->txfm_type_col];
  cfg->stage_num_row = av1_txfm_stage_num_list[cfg->txfm_type_row];
  set_fwd_txfm_non_scale_range(cfg);
}